

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssbase_type.cpp
# Opt level: O1

void DeleteNode(LinkList *pList,LinkListNode *pNode)

{
  int iVar1;
  LinkListNode *pLVar2;
  int iVar3;
  
  iVar1 = pList->iNodeCount;
  if (iVar1 == 0) {
    return;
  }
  pLVar2 = pList->pHead;
  if (pLVar2 == pNode) {
    pList->pHead = pNode->pNext;
  }
  else {
    iVar3 = iVar1;
    if (0 < iVar1) {
      do {
        if (pLVar2->pNext == pNode) {
          if (pList->pTail == pNode) {
            pLVar2->pNext = (LinkListNode *)0x0;
            pList->pTail = pLVar2;
          }
          else {
            pLVar2->pNext = pNode->pNext;
          }
          break;
        }
        iVar3 = iVar3 + -1;
        pLVar2 = pLVar2->pNext;
      } while (iVar3 != 0);
    }
  }
  pList->iNodeCount = iVar1 + -1;
  if (pNode->pData != (void *)0x0) {
    free(pNode->pData);
  }
  free(pNode);
  return;
}

Assistant:

void DeleteNode(LinkList* pList, LinkListNode* pNode)
{
	if (pList->iNodeCount == 0)
		return;

	if (pNode == pList->pHead)
	{
		pList->pHead = pNode->pNext;
	}
	else
	{
		LinkListNode* pThroughNode = pList->pHead;
		for (int i = 0; i < pList->iNodeCount; i++)
		{
			if (pThroughNode->pNext == pNode)
			{
				if (pList->pTail == pNode)
				{
					pThroughNode->pNext = NULL;
					pList->pTail = pThroughNode;
				}
				else
				{
					pThroughNode->pNext = pNode->pNext;
				}
				break;
			}
			pThroughNode = pThroughNode->pNext;
		}
	}

	pList->iNodeCount--;
	if (pNode->pData)
		free(pNode->pData);
	free(pNode);
}